

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureFormatTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles3::Functional::TextureCubeFormatCase::testFace(TextureCubeFormatCase *this,CubeFace face)

{
  ostringstream *this_00;
  int preferredHeight;
  TextureFormat log;
  RenderContext *context;
  TextureCube *pTVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  deUint32 dVar5;
  RGBA threshold;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  RandomViewport viewport;
  vector<float,_std::allocator<float>_> texCoord;
  Surface referenceFrame;
  Surface renderedFrame;
  ReferenceParams local_2ac;
  SurfaceAccess local_218;
  TextureFormatInfo spec;
  undefined1 local_1b8 [16];
  ConstPixelBufferAccess *local_1a8;
  ConstPixelBufferAccess *pCStack_1a0;
  ConstPixelBufferAccess *local_198;
  ConstPixelBufferAccess *pCStack_190;
  ConstPixelBufferAccess *local_188;
  long lVar6;
  
  log = (TextureFormat)((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar3);
  iVar4 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar3 = this->m_width;
  preferredHeight = this->m_height;
  dVar5 = deStringHash((this->super_TestCase).super_TestNode.m_name._M_dataplus._M_p);
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&viewport,(RenderTarget *)CONCAT44(extraout_var_00,iVar4),iVar3,preferredHeight,
             dVar5 + face);
  tcu::Surface::Surface(&renderedFrame,viewport.width,viewport.height);
  tcu::Surface::Surface(&referenceFrame,viewport.width,viewport.height);
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  local_1b8._0_4_ =
       tcu::PixelFormat::getColorThreshold((PixelFormat *)(CONCAT44(extraout_var_01,iVar3) + 8));
  local_2ac.super_RenderParams.texType = 0x1010101;
  threshold = tcu::operator+((RGBA *)local_1b8,(RGBA *)&local_2ac);
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  glu::TextureTestUtil::ReferenceParams::ReferenceParams(&local_2ac,TEXTURETYPE_CUBE);
  tcu::getTextureFormatInfo(&spec,&(this->m_texture->m_refTexture).m_format);
  local_2ac.super_RenderParams.samplerType =
       glu::TextureTestUtil::getSamplerType((this->m_texture->m_refTexture).m_format);
  local_2ac.sampler.magFilter = NEAREST;
  local_2ac.sampler.lodThreshold = 0.0;
  local_2ac.sampler.wrapS = CLAMP_TO_EDGE;
  local_2ac.sampler.wrapT = CLAMP_TO_EDGE;
  local_2ac.sampler.wrapR = CLAMP_TO_EDGE;
  local_2ac.sampler.minFilter = NEAREST;
  local_2ac.sampler.normalizedCoords = true;
  local_2ac.sampler.borderColor.v._8_8_ = 0;
  local_2ac.sampler.compare = COMPAREMODE_NONE;
  local_2ac.sampler.compareChannel = 0;
  local_2ac.sampler.borderColor.v._0_8_ = 0;
  local_2ac.sampler.seamlessCubeMap = true;
  local_2ac.sampler._53_3_ = 0;
  local_2ac.sampler.depthStencilMode = MODE_DEPTH;
  local_2ac.super_RenderParams.colorScale.m_data[0] = spec.lookupScale.m_data[0];
  local_2ac.super_RenderParams.colorScale.m_data[1] = spec.lookupScale.m_data[1];
  local_2ac.super_RenderParams.colorScale.m_data[2] = spec.lookupScale.m_data[2];
  local_2ac.super_RenderParams.colorScale.m_data[3] = spec.lookupScale.m_data[3];
  local_2ac.super_RenderParams.colorBias.m_data[0] = spec.lookupBias.m_data[0];
  local_2ac.super_RenderParams.colorBias.m_data[1] = spec.lookupBias.m_data[1];
  local_2ac.super_RenderParams.colorBias.m_data[2] = spec.lookupBias.m_data[2];
  local_2ac.super_RenderParams.colorBias.m_data[3] = spec.lookupBias.m_data[3];
  if (face == CUBEFACE_NEGATIVE_X) {
    local_2ac.super_RenderParams.flags._0_1_ = (byte)local_2ac.super_RenderParams.flags | 0xc;
  }
  glu::TextureTestUtil::computeQuadTexCoordCube(&texCoord,face);
  this_00 = (ostringstream *)(local_1b8 + 8);
  local_1b8._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(this_00);
  tcu::operator<<((ostream *)this_00,face);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  (**(code **)(lVar6 + 0x1a00))(viewport.x,viewport.y,viewport.width,viewport.height);
  (**(code **)(lVar6 + 8))(0x84c0);
  (**(code **)(lVar6 + 0xb8))(0x8513,this->m_texture->m_glTexture);
  (**(code **)(lVar6 + 0x1360))(0x8513,0x2802,0x812f);
  (**(code **)(lVar6 + 0x1360))(0x8513,0x2803,0x812f);
  (**(code **)(lVar6 + 0x1360))(0x8513,0x2801,0x2600);
  (**(code **)(lVar6 + 0x1360))(0x8513,0x2800,0x2600);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"Set texturing state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureFormatTests.cpp"
                  ,0x180);
  deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
            (&this->m_renderer,0,
             texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,&local_2ac.super_RenderParams);
  context = this->m_renderCtx;
  tcu::Surface::getAccess((PixelBufferAccess *)local_1b8,&renderedFrame);
  glu::readPixels(context,viewport.x,viewport.y,(PixelBufferAccess *)local_1b8);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glReadPixels()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureFormatTests.cpp"
                  ,0x184);
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  tcu::SurfaceAccess::SurfaceAccess
            (&local_218,&referenceFrame,(PixelFormat *)(CONCAT44(extraout_var_02,iVar3) + 8));
  pTVar1 = this->m_texture;
  local_188 = (pTVar1->m_refTexture).m_view.m_levels[5];
  local_1b8._0_4_ = (pTVar1->m_refTexture).m_view.m_numLevels;
  local_1b8._4_4_ = *(undefined4 *)&(pTVar1->m_refTexture).m_view.field_0x4;
  local_1b8._8_8_ = (pTVar1->m_refTexture).m_view.m_levels[0];
  local_1a8 = (pTVar1->m_refTexture).m_view.m_levels[1];
  pCStack_1a0 = (pTVar1->m_refTexture).m_view.m_levels[2];
  local_198 = (pTVar1->m_refTexture).m_view.m_levels[3];
  pCStack_190 = (pTVar1->m_refTexture).m_view.m_levels[4];
  glu::TextureTestUtil::sampleTexture
            (&local_218,(TextureCubeView *)local_1b8,
             texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,&local_2ac);
  bVar2 = glu::TextureTestUtil::compareImages
                    ((TestLog *)log,&referenceFrame,&renderedFrame,threshold);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&texCoord.super__Vector_base<float,_std::allocator<float>_>);
  tcu::Surface::~Surface(&referenceFrame);
  tcu::Surface::~Surface(&renderedFrame);
  return bVar2;
}

Assistant:

bool TextureCubeFormatCase::testFace (tcu::CubeFace face)
{
	TestLog&				log					= m_testCtx.getLog();
	const glw::Functions&	gl					= m_renderCtx.getFunctions();
	RandomViewport			viewport			(m_renderCtx.getRenderTarget(), m_width, m_height, deStringHash(getName())+(deUint32)face);
	tcu::Surface			renderedFrame		(viewport.width, viewport.height);
	tcu::Surface			referenceFrame		(viewport.width, viewport.height);
	tcu::RGBA				threshold			= m_renderCtx.getRenderTarget().getPixelFormat().getColorThreshold() + tcu::RGBA(1,1,1,1);
	vector<float>			texCoord;
	ReferenceParams			renderParams		(TEXTURETYPE_CUBE);
	tcu::TextureFormatInfo	spec				= tcu::getTextureFormatInfo(m_texture->getRefTexture().getFormat());

	renderParams.samplerType				= getSamplerType(m_texture->getRefTexture().getFormat());
	renderParams.sampler					= Sampler(Sampler::CLAMP_TO_EDGE, Sampler::CLAMP_TO_EDGE, Sampler::CLAMP_TO_EDGE, Sampler::NEAREST, Sampler::NEAREST);
	renderParams.sampler.seamlessCubeMap	= true;
	renderParams.colorScale					= spec.lookupScale;
	renderParams.colorBias					= spec.lookupBias;

	// Log render info on first face.
	if (face == tcu::CUBEFACE_NEGATIVE_X)
		renderParams.flags |= RenderParams::LOG_ALL;

	computeQuadTexCoordCube(texCoord, face);

	// \todo [2011-10-28 pyry] Image set name / section?
	log << TestLog::Message << face << TestLog::EndMessage;

	// Setup base viewport.
	gl.viewport(viewport.x, viewport.y, viewport.width, viewport.height);

	// Bind to unit 0.
	gl.activeTexture(GL_TEXTURE0);
	gl.bindTexture(GL_TEXTURE_CUBE_MAP, m_texture->getGLTexture());

	// Setup nearest neighbor filtering and clamp-to-edge.
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MAG_FILTER, GL_NEAREST);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Set texturing state");

	m_renderer.renderQuad(0, &texCoord[0], renderParams);
	glu::readPixels(m_renderCtx, viewport.x, viewport.y, renderedFrame.getAccess());
	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels()");

	// Compute reference.
	sampleTexture(tcu::SurfaceAccess(referenceFrame, m_renderCtx.getRenderTarget().getPixelFormat()), m_texture->getRefTexture(), &texCoord[0], renderParams);

	// Compare and log.
	return compareImages(log, referenceFrame, renderedFrame, threshold);
}